

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeCount(sqlite3 *db,BtCursor *pCur,i64 *pnEntry)

{
  int iVar1;
  uint uVar2;
  u32 uVar3;
  bool bVar4;
  MemPage *local_48;
  MemPage *pPage;
  int iIdx;
  long lStack_30;
  int rc;
  i64 nEntry;
  i64 *pnEntry_local;
  BtCursor *pCur_local;
  sqlite3 *db_local;
  
  lStack_30 = 0;
  iIdx = moveToRoot(pCur);
  if (iIdx == 0x10) {
    *pnEntry = 0;
    db_local._4_4_ = 0;
  }
  else {
    while( true ) {
      bVar4 = false;
      if (iIdx == 0) {
        bVar4 = (db->u1).isInterrupted == 0;
      }
      if (!bVar4) break;
      local_48 = pCur->pPage;
      if ((local_48->leaf != '\0') || (local_48->intKey == '\0')) {
        lStack_30 = (ulong)local_48->nCell + lStack_30;
      }
      if (local_48->leaf != '\0') {
        do {
          if (pCur->iPage == '\0') {
            *pnEntry = lStack_30;
            iVar1 = moveToRoot(pCur);
            return iVar1;
          }
          moveToParent(pCur);
        } while (pCur->pPage->nCell <= pCur->ix);
        pCur->ix = pCur->ix + 1;
        local_48 = pCur->pPage;
      }
      uVar2 = (uint)pCur->ix;
      if (uVar2 == local_48->nCell) {
        uVar3 = sqlite3Get4byte(local_48->aData + (int)(local_48->hdrOffset + 8));
        iIdx = moveToChild(pCur,uVar3);
      }
      else {
        uVar3 = sqlite3Get4byte(local_48->aData +
                                (int)(uint)(local_48->maskPage &
                                           CONCAT11(local_48->aCellIdx[(int)(uVar2 << 1)],
                                                    local_48->aCellIdx[(long)(int)(uVar2 << 1) + 1])
                                           ));
        iIdx = moveToChild(pCur,uVar3);
      }
    }
    db_local._4_4_ = iIdx;
  }
  return db_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCount(sqlite3 *db, BtCursor *pCur, i64 *pnEntry){
  i64 nEntry = 0;                      /* Value to return in *pnEntry */
  int rc;                              /* Return code */

  rc = moveToRoot(pCur);
  if( rc==SQLITE_EMPTY ){
    *pnEntry = 0;
    return SQLITE_OK;
  }

  /* Unless an error occurs, the following loop runs one iteration for each
  ** page in the B-Tree structure (not including overflow pages).
  */
  while( rc==SQLITE_OK && !AtomicLoad(&db->u1.isInterrupted) ){
    int iIdx;                          /* Index of child node in parent */
    MemPage *pPage;                    /* Current page of the b-tree */

    /* If this is a leaf page or the tree is not an int-key tree, then
    ** this page contains countable entries. Increment the entry counter
    ** accordingly.
    */
    pPage = pCur->pPage;
    if( pPage->leaf || !pPage->intKey ){
      nEntry += pPage->nCell;
    }

    /* pPage is a leaf node. This loop navigates the cursor so that it
    ** points to the first interior cell that it points to the parent of
    ** the next page in the tree that has not yet been visited. The
    ** pCur->aiIdx[pCur->iPage] value is set to the index of the parent cell
    ** of the page, or to the number of cells in the page if the next page
    ** to visit is the right-child of its parent.
    **
    ** If all pages in the tree have been visited, return SQLITE_OK to the
    ** caller.
    */
    if( pPage->leaf ){
      do {
        if( pCur->iPage==0 ){
          /* All pages of the b-tree have been visited. Return successfully. */
          *pnEntry = nEntry;
          return moveToRoot(pCur);
        }
        moveToParent(pCur);
      }while ( pCur->ix>=pCur->pPage->nCell );

      pCur->ix++;
      pPage = pCur->pPage;
    }

    /* Descend to the child node of the cell that the cursor currently
    ** points at. This is the right-child if (iIdx==pPage->nCell).
    */
    iIdx = pCur->ix;
    if( iIdx==pPage->nCell ){
      rc = moveToChild(pCur, get4byte(&pPage->aData[pPage->hdrOffset+8]));
    }else{
      rc = moveToChild(pCur, get4byte(findCell(pPage, iIdx)));
    }
  }

  /* An error has occurred. Return an error code. */
  return rc;
}